

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_int64 sqlite3_hard_heap_limit64(sqlite3_int64 n)

{
  int iVar1;
  long in_RDI;
  int rc;
  sqlite3_int64 priorLimit;
  sqlite3_int64 local_8;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    sqlite3_mutex_enter((sqlite3_mutex *)0x133123);
    local_8 = mem0.hardLimit;
    if ((-1 < in_RDI) &&
       ((mem0.hardLimit = in_RDI, in_RDI < mem0.alarmThreshold || (mem0.alarmThreshold == 0)))) {
      mem0.alarmThreshold = in_RDI;
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x133175);
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_hard_heap_limit64(sqlite3_int64 n){
  sqlite3_int64 priorLimit;
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return -1;
#endif
  sqlite3_mutex_enter(mem0.mutex);
  priorLimit = mem0.hardLimit;
  if( n>=0 ){
    mem0.hardLimit = n;
    if( n<mem0.alarmThreshold || mem0.alarmThreshold==0 ){
      mem0.alarmThreshold = n;
    }
  }
  sqlite3_mutex_leave(mem0.mutex);
  return priorLimit;
}